

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,string *pathStr,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey,
          SmallVector<char,_40UL> *buffer)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  SourceBuffer *pSVar6;
  __type_conflict2 _Var7;
  uint uVar8;
  uint64_t hash;
  byte bVar9;
  ulong uVar10;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
  *this_00;
  undefined8 __rhs;
  long lVar11;
  ulong uVar12;
  ulong pos0;
  uint uVar13;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar31;
  error_code ec;
  string name;
  unique_lock<std::shared_mutex> lock;
  path *directory;
  pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
  *in_stack_fffffffffffffed8;
  try_emplace_args_t local_119;
  __uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
  local_118;
  string *local_110;
  path local_108;
  SourceManager *local_e0;
  undefined1 local_d8 [16];
  error_category *local_c8;
  uint64_t local_c0;
  ulong local_b8;
  ulong local_b0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
  *local_a8;
  SourceLibrary *local_a0;
  SourceBuffer *local_98;
  SourceLocation local_90;
  undefined1 local_88 [32];
  unique_lock<std::shared_mutex> local_68;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  _Alloc_hider local_38;
  
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88[0x10] = '\0';
  local_90 = includedFrom;
  if (this->disableProximatePaths == false) {
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
    local_d8._8_8_ = std::_V2::system_category();
    std::filesystem::proximate(&local_108,path,(error_code *)local_d8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               &local_108._M_pathname);
    std::filesystem::__cxx11::path::~path(&local_108);
    if (local_d8._0_4_ != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (char *)0x0,0);
    }
    if (local_88._8_8_ != 0) goto LAB_00277150;
  }
  std::filesystem::__cxx11::path::filename(&local_108,path);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             &local_108._M_pathname);
  std::filesystem::__cxx11::path::~path(&local_108);
LAB_00277150:
  std::unique_lock<std::shared_mutex>::unique_lock(&local_68,&this->mutex);
  std::filesystem::__cxx11::path::parent_path();
  pVar31 = std::
           _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
           ::_M_insert_unique<std::filesystem::__cxx11::path>(&(this->directories)._M_t,&local_108);
  local_a0 = library;
  local_98 = __return_storage_ptr__;
  std::filesystem::__cxx11::path::~path(&local_108);
  local_38._M_p = (pointer)(pVar31.first._M_node._M_node + 1);
  std::
  make_unique<slang::SourceManager::FileData,std::filesystem::__cxx11::path_const*&,std::__cxx11::string,slang::SmallVector<char,40ul>,std::filesystem::__cxx11::path>
            ((path **)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
             (SmallVector<char,_40UL> *)local_88,(path *)buffer);
  this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
             *)&this->lookupCache;
  local_c8 = (error_category *)std::_V2::system_category();
  local_d8._0_8_ =
       local_118._M_t.
       super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
       .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl;
  local_118._M_t.
  super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
  .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl =
       (tuple<slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
        )(_Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
          )0x0;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
  local_110 = pathStr;
  hash = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                       *)this_00,pathStr);
  pos0 = hash >> ((byte)(this->lookupCache).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  lVar11 = (hash & 0xff) * 4;
  uVar15 = (&UNK_004a00ac)[lVar11];
  uVar16 = (&UNK_004a00ad)[lVar11];
  uVar17 = (&UNK_004a00ae)[lVar11];
  bVar18 = (&UNK_004a00af)[lVar11];
  uVar13 = (uint)hash;
  uVar10 = 0;
  uVar12 = pos0;
  uVar19 = uVar15;
  uVar20 = uVar16;
  uVar21 = uVar17;
  bVar22 = bVar18;
  uVar23 = uVar15;
  uVar24 = uVar16;
  uVar25 = uVar17;
  bVar26 = bVar18;
  uVar27 = uVar15;
  uVar28 = uVar16;
  uVar29 = uVar17;
  bVar30 = bVar18;
  local_e0 = this;
  do {
    pgVar2 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar12;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bVar9 = pgVar1->m[0xf].n;
    auVar14[0] = -(local_48 == uVar15);
    auVar14[1] = -(uStack_47 == uVar16);
    auVar14[2] = -(uStack_46 == uVar17);
    auVar14[3] = -(bStack_45 == bVar18);
    auVar14[4] = -(uStack_44 == uVar19);
    auVar14[5] = -(uStack_43 == uVar20);
    auVar14[6] = -(uStack_42 == uVar21);
    auVar14[7] = -(bStack_41 == bVar22);
    auVar14[8] = -(uStack_40 == uVar23);
    auVar14[9] = -(uStack_3f == uVar24);
    auVar14[10] = -(uStack_3e == uVar25);
    auVar14[0xb] = -(bStack_3d == bVar26);
    auVar14[0xc] = -(uStack_3c == uVar27);
    auVar14[0xd] = -(uStack_3b == uVar28);
    auVar14[0xe] = -(uStack_3a == uVar29);
    auVar14[0xf] = -(bVar9 == bVar30);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar9;
    if (uVar8 != 0) {
      ppVar3 = (this->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.elements_;
      local_c0 = hash;
      local_b8 = uVar12;
      local_b0 = uVar10;
      local_a8 = this_00;
      local_58 = uVar15;
      uStack_57 = uVar16;
      uStack_56 = uVar17;
      bStack_55 = bVar18;
      uStack_54 = uVar19;
      uStack_53 = uVar20;
      uStack_52 = uVar21;
      bStack_51 = bVar22;
      uStack_50 = uVar23;
      uStack_4f = uVar24;
      uStack_4e = uVar25;
      bStack_4d = bVar26;
      uStack_4c = uVar27;
      uStack_4b = uVar28;
      uStack_4a = uVar29;
      bStack_49 = bVar30;
      do {
        uVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __rhs = ppVar3 + uVar12 * 0xf + (ulong)uVar5;
        _Var7 = std::operator==(local_110,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs);
        if (_Var7) goto LAB_00277376;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
      bVar9 = pgVar2[uVar12].m[0xf].n;
      hash = local_c0;
      uVar10 = local_b0;
      this_00 = local_a8;
      uVar12 = local_b8;
      this = local_e0;
      uVar15 = local_58;
      uVar16 = uStack_57;
      uVar17 = uStack_56;
      bVar18 = bStack_55;
      uVar19 = uStack_54;
      uVar20 = uStack_53;
      uVar21 = uStack_52;
      bVar22 = bStack_51;
      uVar23 = uStack_50;
      uVar24 = uStack_4f;
      uVar25 = uStack_4e;
      bVar26 = bStack_4d;
      uVar27 = uStack_4c;
      uVar28 = uStack_4b;
      uVar29 = uStack_4a;
      bVar30 = bStack_49;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar13 & 7] & bVar9) == 0) break;
    uVar4 = (this->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .arrays.groups_size_mask;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & uVar4;
  } while (uVar10 <= uVar4);
  if ((this->lookupCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
      .size_ctrl.size <
      (this->lookupCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
      .size_ctrl.ml) {
    in_stack_fffffffffffffed8 =
         (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
          *)local_d8;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
              ((locator *)&local_108,this_00,pos0,hash,&local_119,local_110,
               in_stack_fffffffffffffed8);
    __rhs = local_108._M_pathname.field_2._M_allocated_capacity;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>
              ((locator *)&local_108,this_00,hash,&local_119,local_110,
               (pair<std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>,_std::error_code>
                *)local_d8);
    __rhs = local_108._M_pathname.field_2._M_allocated_capacity;
  }
LAB_00277376:
  std::
  unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>::
  ~unique_ptr((unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
               *)local_d8);
  pSVar6 = local_98;
  createBufferEntry(local_98,local_e0,
                    (((value_type_pointer)__rhs)->second).first._M_t.
                    super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                    .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                    local_90,local_a0,sortKey,
                    (unique_lock<std::shared_mutex> *)in_stack_fffffffffffffed8);
  std::
  unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>::
  ~unique_ptr((unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
               *)&local_118);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_68);
  std::__cxx11::string::~string((string *)local_88);
  return pSVar6;
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(fs::path&& path, std::string&& pathStr,
                                        SourceLocation includedFrom, const SourceLibrary* library,
                                        uint64_t sortKey, SmallVector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = getU8Str(fs::proximate(path, ec));
        if (ec)
            name = {};
    }

    if (name.empty())
        name = getU8Str(path.filename());

    std::unique_lock<std::shared_mutex> lock(mutex);

    auto directory = &*directories.insert(path.parent_path()).first;
    auto fd = std::make_unique<FileData>(directory, std::move(name), std::move(buffer),
                                         std::move(path));

    // Note: it's possible that insertion here fails due to another thread
    // racing against us to open and insert the same file. We do a lookup
    // in the cache before proceeding to read the file but we drop the lock
    // during the read. It's not actually a problem, we'll just use the data
    // we already loaded (just like we had gotten a hit on the cache in the
    // first place).
    auto [it, inserted] = lookupCache.emplace(pathStr, std::pair{std::move(fd), std::error_code{}});

    FileData* fdPtr = it->second.first.get();
    return createBufferEntry(fdPtr, includedFrom, library, sortKey, lock);
}